

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O1

void __thiscall
duckdb::WriteAheadLog::WriteSetTable(WriteAheadLog *this,string *schema,string *table)

{
  BinarySerializer *this_00;
  WriteAheadLogSerializer serializer;
  WriteAheadLogSerializer WStack_5c8;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&WStack_5c8,this,USE_TABLE);
  this_00 = &WStack_5c8.serializer;
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"schema");
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[0x1c])(this_00,schema);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x66,"table");
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[0x1c])(this_00,table);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  BinarySerializer::OnObjectEnd(this_00);
  ChecksumWriter::Flush(&WStack_5c8.checksum_writer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&WStack_5c8);
  return;
}

Assistant:

void WriteAheadLog::WriteSetTable(const string &schema, const string &table) {
	WriteAheadLogSerializer serializer(*this, WALType::USE_TABLE);
	serializer.WriteProperty(101, "schema", schema);
	serializer.WriteProperty(102, "table", table);
	serializer.End();
}